

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kbcore.c
# Opt level: O2

void kbcore_free(kbcore_t *kbcore)

{
  if (kbcore->dict != (dict_t *)0x0) {
    dict_free(kbcore->dict);
    kbcore->dict = (dict_t *)0x0;
  }
  if (kbcore->dict2pid != (dict2pid_t *)0x0) {
    dict2pid_free(kbcore->dict2pid);
    kbcore->dict2pid = (dict2pid_t *)0x0;
  }
  if (kbcore->mdef != (mdef_t *)0x0) {
    mdef_free(kbcore->mdef);
    kbcore->mdef = (mdef_t *)0x0;
  }
  if (kbcore->fillpen != (fillpen_t *)0x0) {
    fillpen_free(kbcore->fillpen);
    kbcore->fillpen = (fillpen_t *)0x0;
  }
  if (kbcore->tmat != (tmat_t *)0x0) {
    tmat_free(kbcore->tmat);
    kbcore->tmat = (tmat_t *)0x0;
  }
  if (kbcore->svq != (subvq_t *)0x0) {
    subvq_free(kbcore->svq);
    kbcore->svq = (subvq_t *)0x0;
  }
  if (kbcore->mgau != (mgau_model_t *)0x0) {
    mgau_free(kbcore->mgau);
    kbcore->mgau = (mgau_model_t *)0x0;
  }
  if (kbcore->ms_mgau != (ms_mgau_model_t *)0x0) {
    ms_mgau_free(kbcore->ms_mgau);
    kbcore->ms_mgau = (ms_mgau_model_t *)0x0;
  }
  if (kbcore->s2_mgau != (s2_semi_mgau_t *)0x0) {
    s2_semi_mgau_free(kbcore->s2_mgau);
    kbcore->s2_mgau = (s2_semi_mgau_t *)0x0;
  }
  if (kbcore->fcb != (feat_t *)0x0) {
    feat_free(kbcore->fcb);
    kbcore->fcb = (feat_t *)0x0;
  }
  logmath_free(kbcore->logmath);
  ckd_free(kbcore);
  return;
}

Assistant:

void
kbcore_free(kbcore_t * kbcore)
{
#if 0
    if (kbcore->lmset) {
        lmset_free(kbcore->lmset);
        kbcore->lmset = NULL;
    }
#endif

    /* Clean up the dictionary stuff */
    if (kbcore->dict) {
        dict_free(kbcore->dict);
        kbcore->dict = NULL;
    }

    /* dict2pid */
    if (kbcore->dict2pid) {
        dict2pid_free(kbcore->dict2pid);
        kbcore->dict2pid = NULL;
    }

    /* Clean up the mdef stuff */
    if (kbcore->mdef) {
        mdef_free(kbcore->mdef);
        kbcore->mdef = NULL;
    }

    if (kbcore->fillpen) {
        fillpen_free(kbcore->fillpen);
        kbcore->fillpen = NULL;
    }

    if (kbcore->tmat) {
        tmat_free(kbcore->tmat);
        kbcore->tmat = NULL;
    }

    if (kbcore->svq) {
        subvq_free(kbcore->svq);
        kbcore->svq = NULL;
    }

    if (kbcore->mgau) {
        mgau_free(kbcore->mgau);
        kbcore->mgau = NULL;
    }

    if (kbcore->ms_mgau) {
        ms_mgau_free(kbcore->ms_mgau);
        kbcore->ms_mgau = NULL;
    }

    if (kbcore->s2_mgau) {
        s2_semi_mgau_free(kbcore->s2_mgau);
        kbcore->s2_mgau = NULL;
    }

    /* memory allocated in kbcore */
    if (kbcore->fcb) {
        feat_free(kbcore->fcb);
        kbcore->fcb = NULL;
    }

    /* Free the memory allocated by this module */
    logmath_free(kbcore->logmath);

    /* Free the object */
    ckd_free((void *) kbcore);
}